

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_Objs_Test::TestBody(ProblemTest_Objs_Test *this)

{
  iterator other;
  bool bVar1;
  iterator *piVar2;
  iterator iVar3;
  MutObjective MVar4;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  BVar5;
  AssertionFailure *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_9;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  iterator j;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  iterator i;
  ObjRange objs;
  Problem p;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff668;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  int in_stack_fffffffffffff680;
  Type in_stack_fffffffffffff684;
  undefined4 in_stack_fffffffffffff688;
  int in_stack_fffffffffffff68c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff698;
  Type in_stack_fffffffffffff69c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff6a0;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_fffffffffffff6d0;
  char *in_stack_fffffffffffff6d8;
  char *in_stack_fffffffffffff6e0;
  AssertionResult *in_stack_fffffffffffff6e8;
  AssertHelper *in_stack_fffffffffffff6f0;
  iterator *in_stack_fffffffffffff730;
  iterator *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined1 local_741 [33];
  AssertionResult local_720 [3];
  int local_6f0;
  byte local_6ea;
  allocator<char> local_6e9;
  string local_6e8 [32];
  AssertionResult local_6c8 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_6a8;
  int local_6a0;
  AssertionResult local_698 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_678;
  int local_670;
  AssertionResult local_668;
  string local_658 [48];
  BasicProblem<mp::BasicProblemParams<int>_> *local_628;
  undefined8 uStack_620;
  AssertionResult local_618 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_5f8;
  int local_5f0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_5e8;
  int local_5e0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_5d8;
  int local_5d0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_5c8;
  int local_5c0;
  AssertionResult local_5b8 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_598;
  int local_590;
  BasicProblem<mp::BasicProblemParams<int>_> *local_588;
  int local_580;
  BasicProblem<mp::BasicProblemParams<int>_> *local_578;
  int local_570;
  BasicProblem<mp::BasicProblemParams<int>_> *local_568;
  int local_560;
  AssertionResult local_558;
  string local_548 [48];
  BasicProblem<mp::BasicProblemParams<int>_> *local_518;
  undefined8 uStack_510;
  AssertionResult local_500 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_4e0;
  int local_4d8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4d0;
  int local_4c8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4c0;
  int local_4b8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4b0;
  int local_4a8;
  AssertionResult local_4a0 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_480;
  int local_478;
  BasicProblem<mp::BasicProblemParams<int>_> *local_470;
  int local_468;
  BasicProblem<mp::BasicProblemParams<int>_> *local_460;
  int local_458;
  BasicProblem<mp::BasicProblemParams<int>_> *local_450;
  int local_448;
  AssertionResult local_440;
  iterator local_430 [2];
  Type local_410;
  undefined4 local_40c;
  AssertionResult local_408 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_3e8;
  int local_3e0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3d8;
  int local_3d0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3c8;
  int local_3c0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3b8;
  int local_3b0;
  AssertionResult local_3a8;
  iterator local_398;
  BasicProblem<mp::BasicProblemParams<int>_> *local_388;
  LinearExpr *local_380;
  LinearExpr *local_378;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(in_stack_fffffffffffff690);
  local_378 = (LinearExpr *)
              mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)
                         CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                         in_stack_fffffffffffff684,in_stack_fffffffffffff680);
  local_380 = (LinearExpr *)
              mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)
                         CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                         in_stack_fffffffffffff684,in_stack_fffffffffffff680);
  local_388 = (BasicProblem<mp::BasicProblemParams<int>_> *)
              mp::BasicProblem<mp::BasicProblemParams<int>_>::objs(in_stack_fffffffffffff668);
  iVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::begin((Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                   *)0x11bd91);
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_ = iVar3.item_.
             super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = iVar3.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
           .index_;
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                     in_stack_fffffffffffff67c);
  local_3c8 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3c0 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3b8 = local_3c8;
  local_3b0 = local_3c0;
  BVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::iterator::operator*((iterator *)in_stack_fffffffffffff668);
  local_3e8 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_3e0 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_3d8 = local_3e8;
  local_3d0 = local_3e0;
  testing::internal::EqHelper<false>::
  Compare<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
             (MutObjective *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11bf19);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11bf7c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11bfd4);
  local_40c = 1;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  ::iterator::operator->((iterator *)in_stack_fffffffffffff690);
  local_410 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)0x11c003);
  testing::internal::EqHelper<false>::Compare<mp::obj::Type,mp::obj::Type>
            ((char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
             (Type *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (Type *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_408);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11c0b6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11c119);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c171);
  iVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::iterator::operator++(&local_398,0);
  local_430[0].item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_ = iVar3.item_.
             super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_430[0].item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = iVar3.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
           .index_;
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                     in_stack_fffffffffffff67c);
  local_460 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_458 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_450 = local_460;
  local_448 = local_458;
  BVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::iterator::operator*((iterator *)in_stack_fffffffffffff668);
  local_480 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_478 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_470 = local_480;
  local_468 = local_478;
  testing::internal::EqHelper<false>::
  Compare<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
             (MutObjective *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11c301);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11c364);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c3bc);
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                     in_stack_fffffffffffff67c);
  local_4c0 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_4b8 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_4b0 = local_4c0;
  local_4a8 = local_4b8;
  BVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::iterator::operator*((iterator *)in_stack_fffffffffffff668);
  local_4e0 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_4d8 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_4d0 = local_4e0;
  local_4c8 = local_4d8;
  testing::internal::EqHelper<false>::
  Compare<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
             (MutObjective *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11c511);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11c574);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c5cc);
  uStack_510 = CONCAT44(local_430[0].item_.
                        super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                        ._12_4_,local_430[0].item_.
                                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                .index_);
  local_518 = local_430[0].item_.
              super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ;
  iVar3.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ._4_4_ = in_stack_fffffffffffff67c;
  iVar3.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ._0_4_ = in_stack_fffffffffffff678;
  iVar3.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       in_stack_fffffffffffff680;
  iVar3.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ =
       in_stack_fffffffffffff684;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  ::iterator::operator!=((iterator *)in_stack_fffffffffffff670,iVar3);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff670,
             SUB81((ulong)in_stack_fffffffffffff668 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_500);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
               in_stack_fffffffffffff6d0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    std::__cxx11::string::~string(local_548);
    testing::Message::~Message((Message *)0x11c719);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c794);
  piVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           ::iterator::operator++(local_430);
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_ = (piVar2->item_).
             super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = (piVar2->item_).
           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  _12_4_ = *(undefined4 *)
            &(piVar2->item_).
             super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.field_0xc
  ;
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                     in_stack_fffffffffffff67c);
  local_578 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_570 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_568 = local_578;
  local_560 = local_570;
  BVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::iterator::operator*((iterator *)in_stack_fffffffffffff668);
  local_598 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_590 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_588 = local_598;
  local_580 = local_590;
  testing::internal::EqHelper<false>::
  Compare<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
             (MutObjective *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_558);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11c913);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11c976);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c9ce);
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                     in_stack_fffffffffffff67c);
  local_5d8 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_5d0 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_5c8 = local_5d8;
  local_5c0 = local_5d0;
  BVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::iterator::operator*((iterator *)in_stack_fffffffffffff668);
  local_5f8 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_5f0 = BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_5e8 = local_5f8;
  local_5e0 = local_5f0;
  testing::internal::EqHelper<false>::
  Compare<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
             (MutObjective *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11cb23);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11cb86);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11cbde);
  uStack_620 = CONCAT44(local_430[0].item_.
                        super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                        ._12_4_,local_430[0].item_.
                                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                .index_);
  local_628 = local_430[0].item_.
              super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ;
  other.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ._4_4_ = in_stack_fffffffffffff67c;
  other.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ._0_4_ = in_stack_fffffffffffff678;
  other.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       in_stack_fffffffffffff680;
  other.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ =
       in_stack_fffffffffffff684;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  ::iterator::operator==((iterator *)in_stack_fffffffffffff670,other);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff670,
             SUB81((ulong)in_stack_fffffffffffff668 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_618);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
               in_stack_fffffffffffff6d0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    std::__cxx11::string::~string(local_658);
    testing::Message::~Message((Message *)0x11cd2b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11cda6);
  iVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::end((Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                 *)in_stack_fffffffffffff670);
  local_678 = iVar3.item_.
              super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ;
  local_670 = iVar3.item_.
              super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  testing::internal::
  CmpHelperNE<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
            ((char *)local_678,(char *)CONCAT44(local_670,in_stack_fffffffffffff740),
             in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_668);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11ce7e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11cee1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11cf39);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  ::iterator::operator++(&local_398);
  iVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::end((Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                 *)in_stack_fffffffffffff670);
  local_6a8 = iVar3.item_.
              super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
  ;
  local_6a0 = iVar3.item_.
              super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  testing::internal::EqHelper<false>::
  Compare<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
            ((char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
             (iterator *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (iterator *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_698);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11d028);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11d08b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11d0e3);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6b0,
               (char *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
               (allocator<char> *)in_stack_fffffffffffff6a0);
    std::allocator<char>::~allocator(&local_6e9);
    local_6ea = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::
      Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
      ::iterator::operator->((iterator *)in_stack_fffffffffffff690);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::
      BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
      ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)0x11d1a2);
    }
    if ((local_6ea & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff6a0,
                 (char (*) [95])CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
      local_6f0 = 2;
    }
    else {
      local_6f0 = 0;
    }
    std::__cxx11::string::~string(local_6e8);
    if (local_6f0 != 0) goto LAB_0011d45b;
  }
  else {
LAB_0011d45b:
    testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11d477);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
               (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
               (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
    testing::Message::~Message((Message *)0x11d4d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11d52c);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_720);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_741;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8),
               (allocator<char> *)in_stack_fffffffffffff6a0);
    std::allocator<char>::~allocator((allocator<char> *)local_741);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
              ::iterator::operator*((iterator *)in_stack_fffffffffffff668);
      in_stack_fffffffffffff6a0 =
           BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
           problem_;
      in_stack_fffffffffffff69c =
           BVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
           index_;
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)in_stack_fffffffffffff6a0,
               (char (*) [88])CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    local_6f0 = 3;
    std::__cxx11::string::~string((string *)(local_741 + 1));
    if (local_6f0 == 0) goto LAB_0011d94f;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff6a0);
  testing::AssertionResult::failure_message((AssertionResult *)0x11d8ac);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
             (char *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
             (char *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffff6f0,(Message *)in_stack_fffffffffffff6e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff670);
  testing::Message::~Message((Message *)0x11d907);
LAB_0011d94f:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11d95c);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(in_stack_fffffffffffff670);
  return;
}

Assistant:

TEST(ProblemTest, Objs) {
  Problem p;
  p.AddObj(mp::obj::MAX);
  p.AddObj(mp::obj::MIN);
  Problem::ObjRange objs = p.objs();
  Problem::ObjRange::iterator i = objs.begin();
  // Test dereference.
  EXPECT_EQ(p.obj(0), *i);
  // Test the arrow operator.
  EXPECT_EQ(mp::obj::MAX, i->type());
  // Test postincrement.
  Problem::ObjRange::iterator j = i++;
  EXPECT_EQ(p.obj(0), *j);
  EXPECT_EQ(p.obj(1), *i);
  EXPECT_TRUE(i != j);
  // Test preincrement.
  i = ++j;
  EXPECT_EQ(p.obj(1), *j);
  EXPECT_EQ(p.obj(1), *i);
  EXPECT_TRUE(i == j);
  // Test end.
  EXPECT_NE(i, objs.end());
  EXPECT_EQ(++i, objs.end());
  // Test invalid access.
  EXPECT_ASSERT(i->type(), "invalid access");
  EXPECT_ASSERT(*i, "invalid access");
}